

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

TableFunctionSet *
duckdb::MultiFileReader::CreateFunctionSet
          (TableFunctionSet *__return_storage_ptr__,TableFunction *table_function)

{
  vector<duckdb::TableFunction,_true> *this;
  reference this_00;
  LogicalType local_3e0;
  LogicalType local_3c8;
  string local_3b0;
  TableFunction local_390;
  TableFunction local_1d8;
  
  ::std::__cxx11::string::string
            ((string *)&local_3b0,
             (string *)
             &(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.
              super_Function.name);
  TableFunctionSet::TableFunctionSet(__return_storage_ptr__,&local_3b0);
  ::std::__cxx11::string::~string((string *)&local_3b0);
  TableFunction::TableFunction(&local_1d8,table_function);
  this = &(__return_storage_ptr__->super_FunctionSet<duckdb::TableFunction>).functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1d8);
  TableFunction::~TableFunction(&local_1d8);
  LogicalType::LogicalType(&local_3e0,VARCHAR);
  LogicalType::LIST(&local_3c8,&local_3e0);
  this_00 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.
                        arguments,0);
  LogicalType::operator=(this_00,&local_3c8);
  LogicalType::~LogicalType(&local_3c8);
  LogicalType::~LogicalType(&local_3e0);
  TableFunction::TableFunction(&local_390,table_function);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_390);
  TableFunction::~TableFunction(&local_390);
  return __return_storage_ptr__;
}

Assistant:

TableFunctionSet MultiFileReader::CreateFunctionSet(TableFunction table_function) {
	TableFunctionSet function_set(table_function.name);
	function_set.AddFunction(table_function);
	D_ASSERT(!table_function.arguments.empty() && table_function.arguments[0] == LogicalType::VARCHAR);
	table_function.arguments[0] = LogicalType::LIST(LogicalType::VARCHAR);
	function_set.AddFunction(std::move(table_function));
	return function_set;
}